

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.C
# Opt level: O3

bool __thiscall Filter::matchDir(Filter *this,string *name)

{
  char cVar1;
  int iVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (this->m_args->_inDirs).super__List_base<String,_std::allocator<String>_>._M_impl._M_node
           .super__List_node_base._M_next;
  if (p_Var3 == (_List_node_base *)&this->m_args->_inDirs) {
    cVar1 = '\x01';
  }
  else {
    do {
      iVar2 = fnmatch((char *)(p_Var3 + 1),(char *)name,(uint)*(byte *)&p_Var3[3]._M_next);
      if ((char)iVar2 != '\0') {
        return (bool)(char)iVar2;
      }
      p_Var3 = p_Var3->_M_next;
      cVar1 = '\0';
    } while (p_Var3 != (_List_node_base *)&this->m_args->_inDirs);
  }
  return (bool)cVar1;
}

Assistant:

bool Filter::matchDir(std::string const & name) const
{
    bool match = m_args.includeDirs().empty();

    // Include filters
    std::list<String>::const_iterator it = m_args.includeDirs().begin();
    for (; !match && it != m_args.includeDirs().end(); ++it) {
		match = fnmatch(*it, name, it->noCase());
    }

    return match;
}